

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

bool __thiscall FSerializer::BeginObject(FSerializer *this,char *name)

{
  uint uVar1;
  FWriter *pFVar2;
  FReader *this_00;
  Pointer pGVar3;
  FJSONObject *pFVar4;
  bool bVar5;
  Value *pVVar6;
  
  if (this->w == (FWriter *)0x0) {
    pVVar6 = FReader::FindKey(this->r,name);
    if (pVVar6 != (Value *)0x0) {
      if ((pVVar6->data_).f.flags != 3) {
        __assert_fail("val->IsObject()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x249,"bool FSerializer::BeginObject(const char *)");
      }
      this_00 = this->r;
      pGVar3 = (Pointer)(pVVar6->data_).s.str;
      TArray<FJSONObject,_FJSONObject>::Grow(&this_00->mObjects,1);
      uVar1 = (this_00->mObjects).Count;
      pFVar4 = (this_00->mObjects).Array;
      pFVar4[uVar1].mObject = pVVar6;
      pFVar4[uVar1].mIterator.ptr_ = pGVar3;
      pFVar4[uVar1].mIndex = 0;
      (this_00->mObjects).Count = uVar1 + 1;
      if (pVVar6 != (Value *)0x0) goto LAB_00479c7c;
    }
    bVar5 = false;
  }
  else {
    WriteKey(this,name);
    FWriter::StartObject(this->w);
    pFVar2 = this->w;
    TArray<bool,_bool>::Grow(&pFVar2->mInObject,1);
    uVar1 = (pFVar2->mInObject).Count;
    (pFVar2->mInObject).Array[uVar1] = true;
    (pFVar2->mInObject).Count = uVar1 + 1;
LAB_00479c7c:
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool FSerializer::BeginObject(const char *name)
{
	if (isWriting())
	{
		WriteKey(name);
		w->StartObject();
		w->mInObject.Push(true);
	}
	else
	{
		auto val = r->FindKey(name);
		if (val != nullptr)
		{
			assert(val->IsObject());
			if (val->IsObject())
			{
				r->mObjects.Push(FJSONObject(val));
			}
			else
			{
				Printf(TEXTCOLOR_RED "Object expected for '%s'", name);
				mErrors++;
				return false;
			}
		}
		else
		{
			return false;
		}
	}
	return true;
}